

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O0

bool __thiscall
wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<bool>_>::matches
          (Matcher<wasm::Match::Internal::AnyKind<bool>_> *this,
          candidate_t<wasm::Match::Internal::AnyKind<bool>_> candidate)

{
  bool bVar1;
  bool local_29;
  MatchSelf<wasm::Match::Internal::AnyKind<bool>_> local_1b;
  matched_t<wasm::Match::Internal::AnyKind<bool>_> local_1a;
  undefined1 local_19;
  matched_t<wasm::Match::Internal::AnyKind<bool>_> casted;
  Matcher<wasm::Match::Internal::AnyKind<bool>_> *pMStack_18;
  candidate_t<wasm::Match::Internal::AnyKind<bool>_> candidate_local;
  Matcher<wasm::Match::Internal::AnyKind<bool>_> *this_local;
  
  local_19 = candidate;
  pMStack_18 = this;
  bVar1 = dynCastCandidate<wasm::Match::Internal::AnyKind<bool>,_0>(candidate,&local_1a);
  if (bVar1) {
    if (this->binder != (matched_t<wasm::Match::Internal::AnyKind<bool>_> *)0x0) {
      *this->binder = (matched_t<wasm::Match::Internal::AnyKind<bool>_>)(local_1a & 1);
    }
    bVar1 = MatchSelf<wasm::Match::Internal::AnyKind<bool>_>::operator()(&local_1b,local_1a & 1);
    local_29 = false;
    if (bVar1) {
      local_29 = Components<wasm::Match::Internal::AnyKind<bool>,_0,_void>::match(local_1a & 1);
    }
    this_local._7_1_ = local_29;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool matches(candidate_t<Kind> candidate) {
    matched_t<Kind> casted;
    if (dynCastCandidate<Kind>(candidate, casted)) {
      if (binder != nullptr) {
        *binder = casted;
      }
      return MatchSelf<Kind>{}(casted, data) &&
             Components<Kind, 0, Matchers...>::match(casted, submatchers);
    }
    return false;
  }